

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_primitives_lib.c
# Opt level: O2

void mem_prim_set32(uint32_t *dp,uint32_t len,uint32_t value)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    switch(len) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return;
    case 0xf:
      *dp = value;
      dp = dp + 1;
    case 0xe:
      *dp = value;
      dp = dp + 1;
    case 0xd:
      *dp = value;
      dp = dp + 1;
    case 0xc:
      *dp = value;
      dp = dp + 1;
    case 0xb:
      *dp = value;
      dp = dp + 1;
    case 10:
      *dp = value;
      dp = dp + 1;
    case 9:
      *dp = value;
      dp = dp + 1;
    case 8:
      *dp = value;
      dp = dp + 1;
    case 7:
      *dp = value;
      dp = dp + 1;
    case 6:
      *dp = value;
      dp = dp + 1;
    case 5:
      *dp = value;
      dp = dp + 1;
    case 4:
      *dp = value;
      dp = dp + 1;
    case 3:
      *dp = value;
      dp = dp + 1;
    case 2:
      *dp = value;
      dp = dp + 1;
    case 1:
      *dp = value;
      dp = dp + 1;
      len = 0;
      break;
    default:
      *dp = value;
      dp[1] = value;
      dp[2] = value;
      dp[3] = value;
      dp[4] = value;
      dp[5] = value;
      dp[6] = value;
      dp[7] = value;
      dp[8] = value;
      dp[9] = value;
      dp[10] = value;
      dp[0xb] = value;
      dp[0xc] = value;
      dp[0xd] = value;
      dp[0xe] = value;
      dp[0xf] = value;
      dp = dp + 0x10;
      len = len - 0x10;
    }
  } while( true );
}

Assistant:

void
mem_prim_set32 (uint32_t *dp, uint32_t len, uint32_t value)
{

    while (len != 0) {

        switch (len) {
        /*
         * Here we do blocks of 8.  Once the remaining count
         * drops below 8, take the fast track to finish up.
         */
        default:
            *dp++ = value; *dp++ = value; *dp++ = value; *dp++ = value;
            *dp++ = value; *dp++ = value; *dp++ = value; *dp++ = value;
            *dp++ = value; *dp++ = value; *dp++ = value; *dp++ = value;
            *dp++ = value; *dp++ = value; *dp++ = value; *dp++ = value;
            len -= 16;
            break;

        case 15:  *dp++ = value;
        case 14:  *dp++ = value;
        case 13:  *dp++ = value;
        case 12:  *dp++ = value;
        case 11:  *dp++ = value;
        case 10:  *dp++ = value;
        case 9:  *dp++ = value;
        case 8:  *dp++ = value;

        case 7:  *dp++ = value;
        case 6:  *dp++ = value;
        case 5:  *dp++ = value;
        case 4:  *dp++ = value;
        case 3:  *dp++ = value;
        case 2:  *dp++ = value;
        case 1:  *dp++ = value;
            len = 0;
            break;
        }
    } /* end while */

    return;
}